

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O0

matrix<int,_2UL> * trng::operator*(matrix<int,_2UL> *a,matrix<int,_2UL> *b)

{
  int iVar1;
  int iVar2;
  unsigned_long *puVar3;
  reference pvVar4;
  const_reference pvVar5;
  matrix<int,_2UL> *in_RDI;
  size_type k_end;
  size_type k;
  int sum;
  size_type j_end_1;
  size_type j_1;
  size_type i_1;
  size_type k0;
  size_type j_end;
  size_type j;
  size_type i;
  size_type j0;
  size_type step;
  matrix<int,_2UL> *res;
  size_type in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  matrix<int,_2UL> *in_stack_ffffffffffffff10;
  unsigned_long local_c0 [2];
  ulong local_b0;
  ulong local_a8;
  int local_9c;
  unsigned_long local_98 [2];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  unsigned_long local_58 [2];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  undefined1 local_19;
  
  local_19 = 0;
  matrix<int,_2UL>::matrix(in_stack_ffffffffffffff10);
  local_28 = 0x20;
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 0x20) {
    for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
      local_40 = local_30;
      local_58[1] = 2;
      local_58[0] = local_30 + 0x20;
      puVar3 = utility::min<unsigned_long>(local_58 + 1,local_58);
      local_48 = *puVar3;
      for (; local_40 < local_48; local_40 = local_40 + 1) {
        pvVar4 = matrix<int,_2UL>::operator()
                           ((matrix<int,_2UL> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffee8,0x404af3);
        *pvVar4 = 0;
      }
    }
    for (local_70 = 0; local_70 < 2; local_70 = local_70 + 0x20) {
      for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
        local_80 = local_30;
        local_98[1] = 2;
        local_98[0] = local_30 + 0x20;
        puVar3 = utility::min<unsigned_long>(local_98 + 1,local_98);
        local_88 = *puVar3;
        for (; local_80 < local_88; local_80 = local_80 + 1) {
          local_9c = 0;
          local_a8 = local_70;
          local_c0[1] = 2;
          local_c0[0] = local_70 + 0x20;
          puVar3 = utility::min<unsigned_long>(local_c0 + 1,local_c0);
          local_b0 = *puVar3;
          for (; iVar2 = local_9c, local_a8 < local_b0; local_a8 = local_a8 + 1) {
            pvVar5 = matrix<int,_2UL>::operator()
                               ((matrix<int,_2UL> *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                in_stack_fffffffffffffee8,0x404c81);
            iVar1 = *pvVar5;
            pvVar5 = matrix<int,_2UL>::operator()
                               ((matrix<int,_2UL> *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                in_stack_fffffffffffffee8,0x404ca1);
            local_9c = iVar2 + iVar1 * *pvVar5;
          }
          pvVar4 = matrix<int,_2UL>::operator()
                             ((matrix<int,_2UL> *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8,0x404cdf);
          in_stack_fffffffffffffef4 = *pvVar4 + local_9c;
          pvVar4 = matrix<int,_2UL>::operator()
                             ((matrix<int,_2UL> *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8,0x404d11);
          *pvVar4 = in_stack_fffffffffffffef4;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }